

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitStream.cpp
# Opt level: O2

void updateBits(uint8_t *buffer,int bitOffset,int bitLen,int value)

{
  uint uVar1;
  int iVar2;
  byte *buffer_00;
  BitStreamWriter bitWriter;
  
  buffer_00 = buffer + bitOffset / 8;
  bitWriter.super_BitStream.m_totalBits = 0;
  bitWriter.m_curVal = 0;
  bitWriter.m_bitWrited = 0;
  bitWriter.super_BitStream.m_buffer = (uint *)0x0;
  bitWriter.super_BitStream.m_initBuffer = (uint *)0x0;
  BitStreamWriter::setBuffer(&bitWriter,buffer_00,buffer_00 + (long)(bitLen / 8) + 5);
  iVar2 = (bitOffset + bitLen) % 8;
  uVar1 = (uint)((long)bitOffset % 8);
  if (0 < (int)uVar1) {
    BitStreamWriter::putBits
              (&bitWriter,uVar1,(uint)(*buffer_00 >> (8U - (char)((long)bitOffset % 8) & 0x1f)));
  }
  BitStreamWriter::putBits(&bitWriter,bitLen,value);
  if (0 < iVar2) {
    uVar1 = 8 - iVar2;
    BitStreamWriter::putBits
              (&bitWriter,uVar1,
               ~(-1 << ((byte)uVar1 & 0x1f)) & (uint)buffer[(bitOffset + bitLen) / 8]);
  }
  BitStreamWriter::flushBits(&bitWriter);
  return;
}

Assistant:

void updateBits(uint8_t* buffer, const int bitOffset, const int bitLen, const int value)
{
    uint8_t* ptr = buffer + bitOffset / 8;
    BitStreamWriter bitWriter{};
    const int byteOffset = bitOffset % 8;
    bitWriter.setBuffer(ptr, ptr + (bitLen / 8 + 5));

    const uint8_t* ptr_end = buffer + (bitOffset + bitLen) / 8;
    const int endBitsPostfix = 8 - ((bitOffset + bitLen) % 8);

    if (byteOffset > 0)
    {
        const int prefix = *ptr >> (8 - byteOffset);
        bitWriter.putBits(byteOffset, prefix);
    }
    bitWriter.putBits(bitLen, value);

    if (endBitsPostfix < 8)
    {
        const int postfix = *ptr_end & (1 << endBitsPostfix) - 1;
        bitWriter.putBits(endBitsPostfix, postfix);
    }
    bitWriter.flushBits();
}